

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> * __thiscall
Catch::TestRegistry::getAllTestsSorted(TestRegistry *this,IConfig *config)

{
  long lVar1;
  pointer pTVar2;
  pointer pTVar3;
  InWhatOrder IVar4;
  int iVar5;
  InWhatOrder IVar6;
  ulong uVar7;
  RandomNumberGenerator rng;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_60;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_48;
  
  if ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    enforceNoDuplicateTestCases(&this->m_functions);
  }
  IVar6 = this->m_currentSortOrder;
  IVar4 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(config);
  if ((IVar6 != IVar4) ||
     ((this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sortedFunctions).
      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
              (&local_60,&this->m_functions);
    iVar5 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(config);
    pTVar3 = local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar2 = local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5 == 1) {
      if (local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar7 = ((long)local_60.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_60.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * -0x5075075075075075;
        lVar1 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar2,pTVar3);
      }
    }
    else if (iVar5 == 2) {
      seedRng(config);
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::RandomNumberGenerator&>
                ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(RandomNumberGenerator *)&local_48);
    }
    local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->m_sortedFunctions).
         super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->m_sortedFunctions).
         super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (this->m_sortedFunctions).
         super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->m_sortedFunctions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->m_sortedFunctions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->m_sortedFunctions).super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_48);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_60);
    IVar6 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(config);
    this->m_currentSortOrder = IVar6;
  }
  return &this->m_sortedFunctions;
}

Assistant:

virtual std::vector<TestCase> const& getAllTestsSorted( IConfig const& config ) const {
            if( m_sortedFunctions.empty() )
                enforceNoDuplicateTestCases( m_functions );

            if(  m_currentSortOrder != config.runOrder() || m_sortedFunctions.empty() ) {
                m_sortedFunctions = sortTests( config, m_functions );
                m_currentSortOrder = config.runOrder();
            }
            return m_sortedFunctions;
        }